

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayObjectTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::VertexArrayObjectTest::init(VertexArrayObjectTest *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  bool bVar2;
  GLenum GVar3;
  deBool dVar4;
  size_type sVar5;
  reference pvVar6;
  ShaderProgram *pSVar7;
  MessageBuilder *pMVar8;
  TestError *this_00;
  deUint8 *pdVar9;
  MessageBuilder local_338;
  MessageBuilder local_1b8;
  GLuint local_24;
  deUint8 *pdStack_20;
  GLuint buffer;
  deUint8 *data;
  VertexArrayObjectTest *pVStack_10;
  int bufferNdx;
  VertexArrayObjectTest *this_local;
  
  pVStack_10 = this;
  for (data._4_4_ = 0; iVar1 = data._4_4_,
      sVar5 = std::
              vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
              ::size(&(this->m_spec).buffers), iVar1 < (int)sVar5; data._4_4_ = data._4_4_ + 1) {
    pvVar6 = std::
             vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
             ::operator[](&(this->m_spec).buffers,(long)data._4_4_);
    pdStack_20 = createRandomBufferData(this,pvVar6);
    do {
      glwGenBuffers(1,&local_24);
      GVar3 = glwGetError();
      glu::checkError(GVar3,"glGenBuffers(1, &buffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                      ,0xe5);
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->m_buffers,&local_24);
    do {
      glwBindBuffer(0x8892,local_24);
      GVar3 = glwGetError();
      glu::checkError(GVar3,"glBindBuffer(GL_ARRAY_BUFFER, buffer)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                      ,0xe8);
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    do {
      pvVar6 = std::
               vector<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec,_std::allocator<deqp::gles3::Functional::(anonymous_namespace)::BufferSpec>_>
               ::operator[](&(this->m_spec).buffers,(long)data._4_4_);
      glwBufferData(0x8892,(long)pvVar6->size,pdStack_20,0x88e8);
      GVar3 = glwGetError();
      glu::checkError(GVar3,
                      "glBufferData(GL_ARRAY_BUFFER, m_spec.buffers[bufferNdx].size, data, GL_DYNAMIC_DRAW)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                      ,0xe9);
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    do {
      glwBindBuffer(0x8892,0);
      GVar3 = glwGetError();
      glu::checkError(GVar3,"glBindBuffer(GL_ARRAY_BUFFER, 0)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
                      ,0xea);
      dVar4 = ::deGetFalse();
    } while (dVar4 != 0);
    if (pdStack_20 != (deUint8 *)0x0) {
      operator_delete__(pdStack_20);
    }
  }
  pSVar7 = createProgram(this,&(this->m_spec).vao);
  this->m_vaoProgram = pSVar7;
  tcu::TestLog::operator<<(&local_1b8,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<
                     (&local_1b8,(char (*) [38])"Program used with Vertex Array Object");
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1b8);
  glu::operator<<(this->m_log,this->m_vaoProgram);
  pSVar7 = createProgram(this,&(this->m_spec).state);
  this->m_stateProgram = pSVar7;
  tcu::TestLog::operator<<(&local_338,this->m_log,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar8 = tcu::MessageBuilder::operator<<
                     (&local_338,(char (*) [37])"Program used with Vertex Array State");
  tcu::MessageBuilder::operator<<(pMVar8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_338);
  glu::operator<<(this->m_log,this->m_stateProgram);
  bVar2 = glu::ShaderProgram::isOk(this->m_vaoProgram);
  if ((bVar2) && (bVar2 = glu::ShaderProgram::isOk(this->m_stateProgram), bVar2)) {
    if ((((this->m_spec).useDrawElements & 1U) != 0) &&
       (((this->m_spec).vao.elementArrayBuffer == 0 ||
        ((this->m_spec).state.elementArrayBuffer == 0)))) {
      pdVar9 = generateIndices(this);
      this->m_indices = pdVar9;
    }
    return (int)this;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Failed to compile shaders",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexArrayObjectTests.cpp"
             ,0xfc);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void VertexArrayObjectTest::init (void)
{
	// \note [mika] Index 0 is reserved for 0 buffer
	for (int bufferNdx = 0; bufferNdx < (int)m_spec.buffers.size(); bufferNdx++)
	{
		deUint8* data = createRandomBufferData(m_spec.buffers[bufferNdx]);

		try
		{
			GLuint buffer;
			GLU_CHECK_CALL(glGenBuffers(1, &buffer));
			m_buffers.push_back(buffer);

			GLU_CHECK_CALL(glBindBuffer(GL_ARRAY_BUFFER, buffer));
			GLU_CHECK_CALL(glBufferData(GL_ARRAY_BUFFER, m_spec.buffers[bufferNdx].size, data, GL_DYNAMIC_DRAW));
			GLU_CHECK_CALL(glBindBuffer(GL_ARRAY_BUFFER, 0));

		} catch (...) {
			delete[] data;
			throw;
		}

		delete[] data;
	}

	m_vaoProgram	= createProgram(m_spec.vao);
	m_log << tcu::TestLog::Message << "Program used with Vertex Array Object" << tcu::TestLog::EndMessage;
	m_log << *m_vaoProgram;
	m_stateProgram	= createProgram(m_spec.state);
	m_log << tcu::TestLog::Message << "Program used with Vertex Array State" << tcu::TestLog::EndMessage;
	m_log << *m_stateProgram;

	if (!m_vaoProgram->isOk() || !m_stateProgram->isOk())
		TCU_FAIL("Failed to compile shaders");

	if (m_spec.useDrawElements && (m_spec.vao.elementArrayBuffer == 0 || m_spec.state.elementArrayBuffer == 0))
		m_indices = generateIndices();
}